

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void check_mkstemp_result(uv_fs_t *req)

{
  int iVar1;
  __uid_t _Var2;
  size_t sVar3;
  uv_loop_t *puVar4;
  int **ppiVar5;
  undefined8 uVar6;
  uv_loop_t *puVar7;
  void *pvVar8;
  uv_fs_t *unaff_RBX;
  char *pcVar9;
  int **ppiVar10;
  int **ppiVar11;
  undefined8 *puVar12;
  uv_loop_t *puVar13;
  char *pcVar14;
  undefined8 *puVar15;
  char *pcVar16;
  int **unaff_R14;
  int **ppiVar17;
  int **ppiVar18;
  int **ppiVar19;
  uv_buf_t uVar20;
  undefined1 auStack_f68 [88];
  long lStack_f10;
  long lStack_f08;
  code *pcStack_db0;
  code *pcStack_da8;
  undefined8 uStack_da0;
  char acStack_d90 [88];
  char *pcStack_d38;
  uv_loop_t *puStack_bd8;
  int **ppiStack_bd0;
  code *pcStack_bc8;
  code *pcStack_bc0;
  uv_loop_t *puStack_bb8;
  code *pcStack_bb0;
  int *apiStack_ba8 [11];
  uv_loop_t *puStack_b50;
  int **ppiStack_9f0;
  int **ppiStack_9e8;
  undefined8 uStack_9e0;
  int *apiStack_9d0 [11];
  int **ppiStack_978;
  undefined8 *puStack_818;
  int **ppiStack_810;
  code *pcStack_808;
  code *pcStack_800;
  undefined1 auStack_7f0 [88];
  long lStack_798;
  uint uStack_778;
  code *pcStack_638;
  undefined8 uStack_630;
  int *apiStack_628 [11];
  char *pcStack_5d0;
  char *pcStack_470;
  int **ppiStack_468;
  int *apiStack_450 [11];
  char *pcStack_3f8;
  char *pcStack_298;
  int **ppiStack_290;
  code *pcStack_288;
  undefined8 uStack_280;
  stat64 sStack_270;
  int *apiStack_1e0 [11];
  char *pcStack_188;
  int **ppiStack_180;
  undefined1 auStack_170 [328];
  uv_fs_t *puStack_28;
  int **ppiStack_20;
  
  if (req->fs_type == UV_FS_MKSTEMP) {
    unaff_RBX = req;
    if (req->result < 0) goto LAB_0015474a;
    unaff_R14 = (int **)req->path;
    if (unaff_R14 == (int **)0x0) goto LAB_0015474f;
    ppiStack_20 = (int **)0x1546c4;
    sVar3 = strlen((char *)unaff_R14);
    if (sVar3 != 0x10) goto LAB_00154754;
    if (*(short *)(unaff_R14 + 1) != 0x5f65 || *unaff_R14 != (int *)0x6c69665f74736574)
    goto LAB_00154759;
    if (*(short *)((long)unaff_R14 + 0xe) == 0x5858 && *(int *)((long)unaff_R14 + 10) == 0x58585858)
    goto LAB_0015475e;
    ppiStack_20 = (int **)0x154711;
    check_permission((char *)unaff_R14,0x180);
    ppiStack_20 = (int **)0x154725;
    iVar1 = uv_fs_stat(0,&stat_req,req->path,0);
    if (iVar1 != 0) goto LAB_00154763;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    ppiStack_20 = (int **)0x15474a;
    check_mkstemp_result_cold_1();
LAB_0015474a:
    ppiStack_20 = (int **)0x15474f;
    check_mkstemp_result_cold_2();
LAB_0015474f:
    ppiStack_20 = (int **)0x154754;
    check_mkstemp_result_cold_8();
LAB_00154754:
    ppiStack_20 = (int **)0x154759;
    check_mkstemp_result_cold_3();
LAB_00154759:
    ppiStack_20 = (int **)0x15475e;
    check_mkstemp_result_cold_4();
LAB_0015475e:
    ppiStack_20 = (int **)0x154763;
    check_mkstemp_result_cold_7();
LAB_00154763:
    ppiStack_20 = (int **)0x154768;
    check_mkstemp_result_cold_5();
  }
  ppiStack_20 = (int **)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  pcVar9 = "test_file";
  pcStack_288 = (code *)0x154786;
  puStack_28 = unaff_RBX;
  ppiStack_20 = unaff_R14;
  unlink("test_file");
  pcStack_288 = (code *)0x15478b;
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  pcStack_288 = (code *)0x1547b2;
  iVar1 = uv_fs_open(0,apiStack_1e0,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_188;
  if (iVar1 < 0) {
    pcStack_288 = (code *)0x154b17;
    run_test_fs_fstat_cold_1();
LAB_00154b17:
    pcStack_288 = (code *)0x154b1c;
    run_test_fs_fstat_cold_2();
LAB_00154b1c:
    pcStack_288 = (code *)0x154b21;
    run_test_fs_fstat_cold_3();
LAB_00154b21:
    pcStack_288 = (code *)0x154b26;
    run_test_fs_fstat_cold_4();
LAB_00154b26:
    pcStack_288 = (code *)0x154b2b;
    run_test_fs_fstat_cold_5();
LAB_00154b2b:
    pcStack_288 = (code *)0x154b30;
    run_test_fs_fstat_cold_6();
LAB_00154b30:
    pcStack_288 = (code *)0x154b35;
    run_test_fs_fstat_cold_7();
LAB_00154b35:
    pcStack_288 = (code *)0x154b3a;
    run_test_fs_fstat_cold_8();
LAB_00154b3a:
    pcStack_288 = (code *)0x154b3f;
    run_test_fs_fstat_cold_9();
LAB_00154b3f:
    pcStack_288 = (code *)0x154b44;
    run_test_fs_fstat_cold_10();
LAB_00154b44:
    pcStack_288 = (code *)0x154b49;
    run_test_fs_fstat_cold_11();
LAB_00154b49:
    pcStack_288 = (code *)0x154b4e;
    run_test_fs_fstat_cold_12();
LAB_00154b4e:
    pcStack_288 = (code *)0x154b53;
    run_test_fs_fstat_cold_13();
LAB_00154b53:
    pcStack_288 = (code *)0x154b58;
    run_test_fs_fstat_cold_14();
LAB_00154b58:
    pcStack_288 = (code *)0x154b5d;
    run_test_fs_fstat_cold_15();
LAB_00154b5d:
    pcStack_288 = (code *)0x154b62;
    run_test_fs_fstat_cold_16();
LAB_00154b62:
    pcStack_288 = (code *)0x154b67;
    run_test_fs_fstat_cold_17();
LAB_00154b67:
    pcStack_288 = (code *)0x154b6c;
    run_test_fs_fstat_cold_18();
LAB_00154b6c:
    pcStack_288 = (code *)0x154b71;
    run_test_fs_fstat_cold_19();
LAB_00154b71:
    pcStack_288 = (code *)0x154b76;
    run_test_fs_fstat_cold_20();
LAB_00154b76:
    pcStack_288 = (code *)0x154b7b;
    run_test_fs_fstat_cold_21();
LAB_00154b7b:
    pcStack_288 = (code *)0x154b80;
    run_test_fs_fstat_cold_22();
LAB_00154b80:
    pcStack_288 = (code *)0x154b85;
    run_test_fs_fstat_cold_23();
LAB_00154b85:
    pcStack_288 = (code *)0x154b8a;
    run_test_fs_fstat_cold_24();
LAB_00154b8a:
    pcStack_288 = (code *)0x154b8f;
    run_test_fs_fstat_cold_25();
LAB_00154b8f:
    pcStack_288 = (code *)0x154b94;
    run_test_fs_fstat_cold_26();
LAB_00154b94:
    pcStack_288 = (code *)0x154b99;
    run_test_fs_fstat_cold_27();
LAB_00154b99:
    pcStack_288 = (code *)0x154b9e;
    run_test_fs_fstat_cold_28();
LAB_00154b9e:
    pcStack_288 = (code *)0x154ba3;
    run_test_fs_fstat_cold_29();
LAB_00154ba3:
    pcStack_288 = (code *)0x154ba8;
    run_test_fs_fstat_cold_30();
LAB_00154ba8:
    pcStack_288 = (code *)0x154bad;
    run_test_fs_fstat_cold_31();
LAB_00154bad:
    pcStack_288 = (code *)0x154bb2;
    run_test_fs_fstat_cold_32();
LAB_00154bb2:
    pcStack_288 = (code *)0x154bb7;
    run_test_fs_fstat_cold_33();
LAB_00154bb7:
    pcStack_288 = (code *)0x154bbc;
    run_test_fs_fstat_cold_34();
LAB_00154bbc:
    pcStack_288 = (code *)0x154bc1;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar9 = pcStack_188;
    if ((long)pcStack_188 < 0) goto LAB_00154b17;
    pcStack_288 = (code *)0x1547d8;
    uv_fs_req_cleanup(apiStack_1e0);
    puVar4 = (uv_loop_t *)((ulong)pcVar14 & 0xffffffff);
    pcStack_288 = (code *)0x1547e4;
    iVar1 = fstat64((int)pcVar14,&sStack_270);
    pcVar9 = pcVar14;
    if (iVar1 != 0) goto LAB_00154b1c;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x1547ff;
    iVar1 = uv_fs_fstat(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154b21;
    if (pcStack_188 != (char *)0x0) goto LAB_00154b26;
    if ((ppiStack_180[0x12] != (int *)0x0) &&
       (ppiStack_180[0x12] != (int *)sStack_270.st_ctim.tv_sec)) goto LAB_00154b2b;
    if ((ppiStack_180[0x13] != (int *)0x0) &&
       (ppiStack_180[0x13] != (int *)sStack_270.st_ctim.tv_nsec)) goto LAB_00154b30;
    pcStack_288 = (code *)0x154860;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_280 = 0;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x15489b;
    iVar1 = uv_fs_write(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0xd) goto LAB_00154b35;
    if (pcStack_188 != (char *)0xd) goto LAB_00154b3a;
    unaff_R14 = apiStack_1e0;
    pcStack_288 = (code *)0x1548c3;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_288 = (code *)0x1548da;
    memset(auStack_170,0xaa,0xa0);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x1548e8;
    iVar1 = uv_fs_fstat(0,unaff_R14,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154b3f;
    if (pcStack_188 != (char *)0x0) goto LAB_00154b44;
    unaff_R14 = ppiStack_180;
    if (ppiStack_180[7] != (int *)0xd) goto LAB_00154b49;
    puVar4 = (uv_loop_t *)((ulong)pcVar14 & 0xffffffff);
    pcStack_288 = (code *)0x15491e;
    iVar1 = fstat64((int)pcVar14,&sStack_270);
    if (iVar1 != 0) goto LAB_00154b4e;
    if (*ppiStack_180 != (int *)sStack_270.st_dev) goto LAB_00154b53;
    if (ppiStack_180[1] != (int *)(ulong)sStack_270.st_mode) goto LAB_00154b58;
    if (ppiStack_180[2] != (int *)sStack_270.st_nlink) goto LAB_00154b5d;
    if (ppiStack_180[3] != (int *)(ulong)sStack_270.st_uid) goto LAB_00154b62;
    if (ppiStack_180[4] != (int *)(ulong)sStack_270.st_gid) goto LAB_00154b67;
    if (ppiStack_180[5] != (int *)sStack_270.st_rdev) goto LAB_00154b6c;
    if (ppiStack_180[6] != (int *)sStack_270.st_ino) goto LAB_00154b71;
    if (ppiStack_180[7] != (int *)sStack_270.st_size) goto LAB_00154b76;
    if (ppiStack_180[8] != (int *)sStack_270.st_blksize) goto LAB_00154b7b;
    if (ppiStack_180[9] != (int *)sStack_270.st_blocks) goto LAB_00154b80;
    if (ppiStack_180[0xc] != (int *)sStack_270.st_atim.tv_sec) goto LAB_00154b85;
    if (ppiStack_180[0xd] != (int *)sStack_270.st_atim.tv_nsec) goto LAB_00154b8a;
    if (ppiStack_180[0xe] != (int *)sStack_270.st_mtim.tv_sec) goto LAB_00154b8f;
    if (ppiStack_180[0xf] != (int *)sStack_270.st_mtim.tv_nsec) goto LAB_00154b94;
    if (ppiStack_180[0x10] != (int *)sStack_270.st_ctim.tv_sec) goto LAB_00154b99;
    if (ppiStack_180[0x11] != (int *)sStack_270.st_ctim.tv_nsec) goto LAB_00154b9e;
    if (ppiStack_180[10] != (int *)0x0) goto LAB_00154ba3;
    if (ppiStack_180[0xb] != (int *)0x0) goto LAB_00154ba8;
    unaff_R14 = apiStack_1e0;
    pcStack_288 = (code *)0x154a41;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_288 = (code *)0x154a59;
    puVar4 = loop;
    iVar1 = uv_fs_fstat(loop,unaff_R14,(ulong)pcVar14 & 0xffffffff,fstat_cb);
    if (iVar1 != 0) goto LAB_00154bad;
    pcStack_288 = (code *)0x154a6f;
    puVar4 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154bb2;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_288 = (code *)0x154a8f;
    iVar1 = uv_fs_close(0,apiStack_1e0,(ulong)pcVar14 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154bb7;
    if (pcStack_188 != (char *)0x0) goto LAB_00154bbc;
    pcStack_288 = (code *)0x154ab3;
    uv_fs_req_cleanup(apiStack_1e0);
    pcStack_288 = (code *)0x154ac1;
    uv_run(loop,0);
    pcStack_288 = (code *)0x154acd;
    unlink("test_file");
    pcStack_288 = (code *)0x154ad2;
    pcVar9 = (char *)uv_default_loop();
    pcStack_288 = (code *)0x154ae6;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_288 = (code *)0x154af0;
    uv_run(pcVar9,0);
    pcStack_288 = (code *)0x154af5;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_288 = (code *)0x154afd;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_288 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar4->backend_fd == 8) {
    if (puVar4->watcher_queue[0] != (void *)0x0) goto LAB_00154bf1;
    if (*(long *)((long)puVar4->watcher_queue[1] + 0x38) == 0xd) {
      ppiStack_290 = (int **)0x154be4;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return;
    }
  }
  else {
    ppiStack_290 = (int **)0x154bf1;
    fstat_cb_cold_1();
LAB_00154bf1:
    ppiStack_290 = (int **)0x154bf6;
    fstat_cb_cold_2();
  }
  ppiStack_290 = (int **)run_test_fs_access;
  fstat_cb_cold_3();
  ppiVar17 = apiStack_450;
  ppiVar5 = apiStack_450;
  ppiVar10 = (int **)0x184395;
  pcStack_298 = pcVar9;
  ppiStack_290 = unaff_R14;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_access(0,apiStack_450,"test_file",0,0);
  if (iVar1 < 0) {
    if (-1 < (long)pcStack_3f8) goto LAB_00154e64;
    uv_fs_req_cleanup(apiStack_450);
    puVar4 = loop;
    iVar1 = uv_fs_access(loop,apiStack_450,"test_file",0,access_cb);
    ppiVar10 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154e69;
    puVar4 = loop;
    uv_run(loop,0);
    ppiVar10 = apiStack_450;
    if (access_cb_count != 1) goto LAB_00154e6e;
    access_cb_count = 0;
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,apiStack_450,"test_file",0x42,0x180,0);
    ppiVar11 = (int **)pcStack_3f8;
    ppiVar10 = apiStack_450;
    if (iVar1 < 0) goto LAB_00154e73;
    if ((long)pcStack_3f8 < 0) goto LAB_00154e78;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_450,"test_file",0,0);
    unaff_R14 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154e7d;
    unaff_R14 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154e82;
    uv_fs_req_cleanup(apiStack_450);
    puVar4 = loop;
    iVar1 = uv_fs_access(loop,apiStack_450,"test_file",0,access_cb);
    if (iVar1 != 0) goto LAB_00154e87;
    puVar4 = loop;
    uv_run(loop,0);
    ppiVar17 = apiStack_450;
    if (access_cb_count != 1) goto LAB_00154e8c;
    access_cb_count = 0;
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_close(0,apiStack_450,(ulong)ppiVar11 & 0xffffffff,0);
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154e91;
    ppiVar17 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154e96;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_mkdir(0,apiStack_450,"test_dir",0x1ff,0);
    ppiVar11 = apiStack_450;
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154e9b;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_450,"test_dir",2,0);
    ppiVar17 = apiStack_450;
    if (iVar1 != 0) goto LAB_00154ea0;
    ppiVar5 = apiStack_450;
    ppiVar17 = apiStack_450;
    if (pcStack_3f8 != (char *)0x0) goto LAB_00154ea5;
    uv_fs_req_cleanup(apiStack_450);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    ppiVar5 = (int **)uv_default_loop();
    uv_walk(ppiVar5,close_walk_cb,0);
    uv_run(ppiVar5,0);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    ppiVar17 = apiStack_450;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154e64:
    run_test_fs_access_cold_2();
LAB_00154e69:
    run_test_fs_access_cold_3();
LAB_00154e6e:
    run_test_fs_access_cold_4();
LAB_00154e73:
    ppiVar11 = ppiVar10;
    run_test_fs_access_cold_5();
LAB_00154e78:
    run_test_fs_access_cold_6();
LAB_00154e7d:
    run_test_fs_access_cold_7();
LAB_00154e82:
    ppiVar17 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00154e87:
    run_test_fs_access_cold_9();
LAB_00154e8c:
    run_test_fs_access_cold_10();
LAB_00154e91:
    run_test_fs_access_cold_11();
LAB_00154e96:
    run_test_fs_access_cold_12();
LAB_00154e9b:
    ppiVar5 = ppiVar11;
    run_test_fs_access_cold_13();
LAB_00154ea0:
    run_test_fs_access_cold_14();
LAB_00154ea5:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar4->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup();
    return;
  }
  access_cb_cold_1();
  pcVar9 = "test_file";
  pcStack_638 = (code *)0x154ee1;
  pcStack_470 = (char *)ppiVar5;
  ppiStack_468 = ppiVar17;
  unlink("test_file");
  pcStack_638 = (code *)0x154ee6;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar5 = apiStack_628;
  puVar4 = (uv_loop_t *)0x0;
  pcStack_638 = (code *)0x154f0a;
  iVar1 = uv_fs_open(0,ppiVar5,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_5d0;
  if (iVar1 < 0) {
    pcStack_638 = (code *)0x1551dd;
    run_test_fs_chmod_cold_1();
LAB_001551dd:
    pcStack_638 = (code *)0x1551e2;
    run_test_fs_chmod_cold_2();
LAB_001551e2:
    pcStack_638 = (code *)0x1551e7;
    run_test_fs_chmod_cold_3();
LAB_001551e7:
    pcStack_638 = (code *)0x1551ec;
    run_test_fs_chmod_cold_4();
LAB_001551ec:
    pcStack_638 = (code *)0x1551f1;
    run_test_fs_chmod_cold_5();
LAB_001551f1:
    pcStack_638 = (code *)0x1551f6;
    run_test_fs_chmod_cold_6();
LAB_001551f6:
    pcStack_638 = (code *)0x1551fb;
    run_test_fs_chmod_cold_7();
LAB_001551fb:
    pcStack_638 = (code *)0x155200;
    run_test_fs_chmod_cold_8();
LAB_00155200:
    pcStack_638 = (code *)0x155205;
    run_test_fs_chmod_cold_9();
LAB_00155205:
    pcStack_638 = (code *)0x15520a;
    run_test_fs_chmod_cold_10();
LAB_0015520a:
    pcStack_638 = (code *)0x15520f;
    run_test_fs_chmod_cold_11();
LAB_0015520f:
    pcStack_638 = (code *)0x155214;
    run_test_fs_chmod_cold_12();
LAB_00155214:
    pcStack_638 = (code *)0x155219;
    run_test_fs_chmod_cold_13();
LAB_00155219:
    pcStack_638 = (code *)0x15521e;
    run_test_fs_chmod_cold_14();
LAB_0015521e:
    pcStack_638 = (code *)0x155223;
    run_test_fs_chmod_cold_15();
LAB_00155223:
    pcStack_638 = (code *)0x155228;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar9 = pcStack_5d0;
    if ((long)pcStack_5d0 < 0) goto LAB_001551dd;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x154f2d;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x154f3e;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_630 = 0;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x154f74;
    ppiVar5 = ppiVar17;
    iov = uVar20;
    iVar1 = uv_fs_write(0,ppiVar17,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar14;
    if (iVar1 != 0xd) goto LAB_001551e2;
    if (pcStack_5d0 != (char *)0xd) goto LAB_001551e7;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x154f96;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x154faf;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001551ec;
    if (pcStack_5d0 != (char *)0x0) goto LAB_001551f1;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x154fd0;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x154fe4;
    check_permission("test_file",0x80);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x154ff9;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001551f6;
    if (pcStack_5d0 != (char *)0x0) goto LAB_001551fb;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x15501a;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x15502b;
    check_permission("test_file",0x100);
    puVar4 = (uv_loop_t *)0x0;
    pcStack_638 = (code *)0x15503f;
    ppiVar5 = ppiVar17;
    iVar1 = uv_fs_fchmod(0,ppiVar17,(ulong)pcVar14 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_00155200;
    if (pcStack_5d0 != (char *)0x0) goto LAB_00155205;
    ppiVar17 = apiStack_628;
    pcStack_638 = (code *)0x155060;
    uv_fs_req_cleanup(ppiVar17);
    pcStack_638 = (code *)0x155074;
    check_permission("test_file",0x180);
    apiStack_628[0] = &run_test_fs_chmod::mode;
    pcStack_638 = (code *)0x15509c;
    ppiVar5 = ppiVar17;
    puVar4 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar17,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_0015520a;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x1550b2;
    puVar4 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015520f;
    chmod_cb_count = 0;
    ppiVar5 = apiStack_628;
    apiStack_628[0] = &run_test_fs_chmod::mode_1;
    pcStack_638 = (code *)0x1550f7;
    puVar4 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar5,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155214;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x15510d;
    puVar4 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155219;
    ppiVar5 = apiStack_628;
    apiStack_628[0] = &run_test_fs_chmod::mode_2;
    pcStack_638 = (code *)0x155143;
    puVar4 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar5,(ulong)pcVar14 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015521e;
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x155159;
    puVar4 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_00155223;
    pcStack_638 = (code *)0x15517b;
    uv_fs_close(loop,apiStack_628,(ulong)pcVar14 & 0xffffffff,0);
    pcStack_638 = (code *)0x155189;
    uv_run(loop,0);
    pcStack_638 = (code *)0x155195;
    unlink("test_file");
    pcStack_638 = (code *)0x15519a;
    pcVar9 = (char *)uv_default_loop();
    pcStack_638 = (code *)0x1551ae;
    uv_walk(pcVar9,close_walk_cb,0);
    ppiVar5 = (int **)0x0;
    pcStack_638 = (code *)0x1551b8;
    uv_run(pcVar9);
    pcStack_638 = (code *)0x1551bd;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_638 = (code *)0x1551c5;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_638 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar12 = (undefined8 *)((ulong)ppiVar5 & 0xffffffff);
  puVar15 = (undefined8 *)0x0;
  pcStack_800 = (code *)0x155248;
  pcStack_638 = (code *)pcVar9;
  iVar1 = uv_fs_stat(0,auStack_7f0,puVar4,0);
  if (iVar1 == 0) {
    if (lStack_798 != 0) goto LAB_0015527c;
    if ((uStack_778 & 0x1ff) == (uint)ppiVar5) {
      pcStack_800 = (code *)0x15526e;
      uv_fs_req_cleanup(auStack_7f0);
      return;
    }
  }
  else {
    pcStack_800 = (code *)0x15527c;
    check_permission_cold_1();
LAB_0015527c:
    pcStack_800 = (code *)0x155281;
    check_permission_cold_2();
  }
  pcStack_800 = chmod_cb;
  check_permission_cold_3();
  pcStack_800 = (code *)puVar12;
  if (*(int *)(puVar15 + 8) == 0xd) {
    puVar12 = puVar15;
    if (puVar15[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_808 = (code *)0x1552a5;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*(uint *)*puVar15);
      return;
    }
  }
  else {
    pcStack_808 = (code *)0x1552bc;
    chmod_cb_cold_1();
  }
  pcStack_808 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_808 = (code *)puVar12;
  if (*(int *)(puVar15 + 8) == 0xe) {
    puStack_818 = puVar15;
    if (puVar15[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_810 = (int **)0x1552e0;
      uv_fs_req_cleanup(puVar15);
      check_permission("test_file",*(uint *)*puVar15);
      return;
    }
  }
  else {
    ppiStack_810 = (int **)0x1552f7;
    fchmod_cb_cold_1();
    puStack_818 = puVar12;
  }
  ppiStack_810 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar5 = (int **)0x184395;
  ppiStack_9e8 = (int **)0x155315;
  ppiStack_810 = ppiVar17;
  unlink("test_file");
  ppiStack_9e8 = (int **)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_9e8 = (int **)0x15533e;
  iVar1 = uv_fs_open(0,apiStack_9d0,"test_file",0x42,0x180,0);
  ppiVar10 = ppiStack_978;
  if (iVar1 < 0) {
    ppiStack_9e8 = (int **)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    ppiStack_9e8 = (int **)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    ppiStack_9e8 = (int **)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    ppiStack_9e8 = (int **)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    ppiStack_9e8 = (int **)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    ppiStack_9e8 = (int **)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    ppiStack_9e8 = (int **)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    ppiStack_9e8 = (int **)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar5 = ppiStack_978;
    if ((long)ppiStack_978 < 0) goto LAB_001554db;
    ppiVar17 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x155361;
    uv_fs_req_cleanup(ppiVar17);
    ppiStack_9e8 = (int **)0x155372;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_9e0 = 0;
    ppiStack_9e8 = (int **)0x1553a8;
    iov = uVar20;
    iVar1 = uv_fs_write(0,ppiVar17,(ulong)ppiVar10 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar5 = ppiVar10;
    if (iVar1 != 0xd) goto LAB_001554e0;
    if (ppiStack_978 != (int **)0xd) goto LAB_001554e5;
    ppiVar17 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x1553ca;
    uv_fs_req_cleanup(ppiVar17);
    ppiStack_9e8 = (int **)0x1553dd;
    uv_fs_close(loop,ppiVar17,(ulong)ppiVar10 & 0xffffffff,0);
    ppiStack_9e8 = (int **)0x1553f6;
    iVar1 = uv_fs_chmod(0,ppiVar17,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001554ea;
    if (ppiStack_978 != (int **)0x0) goto LAB_001554ef;
    ppiVar5 = apiStack_9d0;
    ppiStack_9e8 = (int **)0x155417;
    uv_fs_req_cleanup(ppiVar5);
    ppiVar17 = (int **)0x184395;
    ppiStack_9e8 = (int **)0x15542b;
    check_permission("test_file",0x100);
    ppiStack_9e8 = (int **)0x15543a;
    iVar1 = uv_fs_unlink(0,ppiVar5,"test_file",0);
    if (iVar1 != 0) goto LAB_001554f4;
    if (ppiStack_978 != (int **)0x0) goto LAB_001554f9;
    ppiStack_9e8 = (int **)0x15545b;
    uv_fs_req_cleanup(apiStack_9d0);
    ppiStack_9e8 = (int **)0x155469;
    uv_run(loop,0);
    ppiVar17 = (int **)0x184395;
    ppiStack_9e8 = (int **)0x155485;
    uv_fs_chmod(0,apiStack_9d0,"test_file",0x180,0);
    ppiStack_9e8 = (int **)0x15548d;
    uv_fs_req_cleanup(apiStack_9d0);
    ppiStack_9e8 = (int **)0x155495;
    unlink("test_file");
    ppiStack_9e8 = (int **)0x15549a;
    ppiVar5 = (int **)uv_default_loop();
    ppiStack_9e8 = (int **)0x1554ae;
    uv_walk(ppiVar5,close_walk_cb,0);
    ppiStack_9e8 = (int **)0x1554b8;
    uv_run(ppiVar5,0);
    ppiStack_9e8 = (int **)0x1554bd;
    uVar6 = uv_default_loop();
    ppiStack_9e8 = (int **)0x1554c5;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      return;
    }
  }
  ppiStack_9e8 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar18 = apiStack_ba8;
  ppiVar19 = apiStack_ba8;
  ppiVar11 = apiStack_ba8;
  ppiVar10 = apiStack_ba8;
  puVar13 = (uv_loop_t *)0x184395;
  pcStack_bb0 = (code *)0x15551c;
  ppiStack_9f0 = ppiVar5;
  ppiStack_9e8 = ppiVar17;
  unlink("test_file");
  pcStack_bb0 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_bb0 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  pcStack_bb0 = (code *)0x15554f;
  iVar1 = uv_fs_open(0,apiStack_ba8,"test_file",0x42,0x180,0);
  puVar4 = puStack_b50;
  if (iVar1 < 0) {
    pcStack_bb0 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_bb0 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_bb0 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    ppiVar18 = ppiVar17;
    pcStack_bb0 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_bb0 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    ppiVar19 = ppiVar18;
    pcStack_bb0 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_bb0 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_bb0 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_bb0 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_bb0 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_bb0 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_bb0 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_bb0 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    ppiVar11 = ppiVar19;
    pcStack_bb0 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_bb0 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    ppiVar10 = ppiVar11;
    pcStack_bb0 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_bb0 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_bb0 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_bb0 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_bb0 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar13 = puStack_b50;
    if ((long)puStack_b50 < 0) goto LAB_00155820;
    pcStack_bb0 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x15558f;
    iVar1 = uv_fs_chown(0,apiStack_ba8,"test_file",0xffffffff,0xffffffff,0);
    puVar13 = puVar4;
    ppiVar17 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155825;
    ppiVar17 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_bb0 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x1555c8;
    iVar1 = uv_fs_fchown(0,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015582f;
    ppiVar18 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_bb0 = (code *)0x1555e7;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x15560f;
    puVar7 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_ba8,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155839;
    pcStack_bb0 = (code *)0x155625;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_bb0 = (code *)0x15565e;
    puVar7 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_ba8,"test_file",0,0,chown_root_cb);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155843;
    pcStack_bb0 = (code *)0x155674;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_bb0 = (code *)0x1556a4;
    puVar7 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_0015584d;
    pcStack_bb0 = (code *)0x1556ba;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar19 = apiStack_ba8;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x1556e2;
    iVar1 = uv_fs_link(0,apiStack_ba8,"test_file","test_file_link",0);
    ppiVar19 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155857;
    ppiVar19 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_bb0 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x155720;
    iVar1 = uv_fs_lchown(0,apiStack_ba8,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_00155861;
    ppiVar11 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_bb0 = (code *)0x15573f;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x155767;
    puVar7 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_ba8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_0015586b;
    pcStack_bb0 = (code *)0x15577d;
    puVar7 = loop;
    uv_run(loop,0);
    ppiVar10 = apiStack_ba8;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_bb0 = (code *)0x155798;
    iVar1 = uv_fs_close(0,apiStack_ba8,(ulong)puVar4 & 0xffffffff,0);
    ppiVar10 = apiStack_ba8;
    if (iVar1 != 0) goto LAB_00155875;
    ppiVar10 = apiStack_ba8;
    if (puStack_b50 != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_bb0 = (code *)0x1557b4;
    uv_fs_req_cleanup(apiStack_ba8);
    pcStack_bb0 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_bb0 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_bb0 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_bb0 = (code *)0x1557df;
    puVar13 = (uv_loop_t *)uv_default_loop();
    pcStack_bb0 = (code *)0x1557f3;
    uv_walk(puVar13,close_walk_cb,0);
    pcStack_bb0 = (code *)0x1557fd;
    uv_run(puVar13,0);
    pcStack_bb0 = (code *)0x155802;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_bb0 = (code *)0x15580a;
    iVar1 = uv_loop_close();
    ppiVar10 = apiStack_ba8;
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_bb0 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar7->backend_fd == 0x1a) {
    if (puVar7->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_bb8 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_bb8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_bb8 = puVar13;
  if (puVar7->backend_fd == 0x1a) {
    pcStack_bc0 = (code *)0x1558b7;
    puVar4 = puVar7;
    _Var2 = geteuid();
    pvVar8 = puVar7->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar8 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_bc0 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar13 = puVar7;
    if (pvVar8 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar7);
      return;
    }
  }
  else {
    pcStack_bc0 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar4 = puVar7;
  }
  pcStack_bc0 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar4->backend_fd == 0x1b) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_bc8 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_bc8 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar4->backend_fd == 0x1e) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    ppiStack_bd0 = (int **)0x15592b;
    lchown_cb_cold_1();
  }
  ppiStack_bd0 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar9 = "test_file";
  pcStack_da8 = (code *)0x155949;
  puStack_bd8 = puVar13;
  ppiStack_bd0 = ppiVar10;
  unlink("test_file");
  pcStack_da8 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_da8 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_da8 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar16 = (char *)0x0;
  pcStack_da8 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_d90,"test_file",0x42,0x180,0);
  pcVar14 = pcStack_d38;
  if (iVar1 < 0) {
    pcStack_da8 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_da8 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_da8 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_da8 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_da8 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_da8 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar14 = pcVar9;
    pcStack_da8 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_da8 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_da8 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_da8 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_da8 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_da8 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_da8 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar9 = pcVar14;
    pcStack_da8 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_da8 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_da8 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_da8 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_da8 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar9 = pcStack_d38;
    if ((long)pcStack_d38 < 0) goto LAB_00155cc8;
    pcStack_da8 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_d90);
    pcStack_da8 = (code *)0x1559be;
    uVar20 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x1559f4;
    iov = uVar20;
    iVar1 = uv_fs_write(0,acStack_d90,(ulong)pcVar14 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar14;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_d38 != (char *)0xd) goto LAB_00155cd2;
    pcStack_da8 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_d90);
    pcStack_da8 = (code *)0x155a29;
    uv_fs_close(loop,acStack_d90,(ulong)pcVar14 & 0xffffffff,0);
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_d90,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_d38 != (char *)0x0) goto LAB_00155cdc;
    pcStack_da8 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_d90,"test_file_link",2,0,0);
    pcVar14 = pcStack_d38;
    pcVar9 = acStack_d90;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_d38 < 0) goto LAB_00155ce6;
    pcStack_da8 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_d90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_da8 = (code *)0x155ac6;
    uVar20 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155af8;
    iov = uVar20;
    iVar1 = uv_fs_read(0,acStack_d90,(ulong)pcVar14 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_d38 < 0) goto LAB_00155cf0;
    pcVar16 = buf;
    pcStack_da8 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_da8 = (code *)0x155b2e;
    close((int)pcVar14);
    pcStack_da8 = (code *)0x155b54;
    pcVar16 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_d90,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_da8 = (code *)0x155b6a;
    pcVar16 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_d90,"test_file_link2",2,0,0);
    pcVar9 = pcStack_d38;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_d38 < 0) goto LAB_00155d09;
    pcStack_da8 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_d90);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_da8 = (code *)0x155bda;
    uVar20 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_da0 = 0;
    pcVar16 = (char *)0x0;
    pcStack_da8 = (code *)0x155c0c;
    iov = uVar20;
    iVar1 = uv_fs_read(0,acStack_d90,(ulong)pcVar9 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_d38 < 0) goto LAB_00155d13;
    pcVar16 = buf;
    pcStack_da8 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_da8 = (code *)0x155c50;
    uv_fs_close(loop,acStack_d90,(ulong)pcVar9 & 0xffffffff,0);
    pcStack_da8 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_da8 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_da8 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_da8 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_da8 = (code *)0x155c87;
    pcVar9 = (char *)uv_default_loop();
    pcStack_da8 = (code *)0x155c9b;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_da8 = (code *)0x155ca5;
    uv_run(pcVar9,0);
    pcStack_da8 = (code *)0x155caa;
    pcVar16 = (char *)uv_default_loop();
    pcStack_da8 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_da8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar16)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar16)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_db0 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_db0 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_db0 = (code *)pcVar9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_f68,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_f08 != 0) goto LAB_00155e45;
    if (lStack_f10 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_f68);
    iVar1 = uv_fs_readlink(0,auStack_f68,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_f08 != 0) goto LAB_00155e54;
    if (lStack_f10 == -2) {
      uv_fs_req_cleanup(auStack_f68);
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      uVar6 = uv_default_loop();
      iVar1 = uv_loop_close(uVar6);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void check_mkstemp_result(uv_fs_t* req) {
  int r;

  ASSERT(req->fs_type == UV_FS_MKSTEMP);
  ASSERT(req->result >= 0);
  ASSERT(req->path);
  ASSERT(strlen(req->path) == 16);
  ASSERT(memcmp(req->path, "test_file_", 10) == 0);
  ASSERT(memcmp(req->path + 10, "XXXXXX", 6) != 0);
  check_permission(req->path, 0600);

  /* Check if req->path is actually a file */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT(r == 0);
  ASSERT(stat_req.statbuf.st_mode & S_IFREG);
  uv_fs_req_cleanup(&stat_req);
}